

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O1

void __thiscall wasm::Pusher::optimizeIntoIf(Pusher *this,Index firstPushable,Index pushPoint)

{
  Expression *pEVar1;
  PassOptions *pPVar2;
  bool bVar3;
  EffectAnalyzer *other;
  uint uVar4;
  ulong uVar5;
  undefined1 local_640 [8];
  EffectAnalyzer cumulativeEffects;
  EffectAnalyzer ifTrueEffects;
  EffectAnalyzer postIfEffects;
  EffectAnalyzer ifFalseEffects;
  anon_class_40_5_af6c749e maybePushInto;
  Index local_44;
  LocalSet *pLStack_40;
  Index index;
  LocalSet *pushable;
  Index i;
  
  if ((pushPoint <= firstPushable) || (pushPoint == 0xffffffff)) {
    __assert_fail("firstPushable != Index(-1) && pushPoint != Index(-1) && firstPushable < pushPoint"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CodePushing.cpp"
                  ,0x10e,"void wasm::Pusher::optimizeIntoIf(Index, Index)");
  }
  if ((ulong)pushPoint <
      (this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
      usedElements) {
    pEVar1 = (this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
             ).data[pushPoint];
    if (pEVar1->_id == IfId) {
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)local_640,this->passOptions,this->module,
                 *(Expression **)(pEVar1 + 1));
      EffectAnalyzer::ignoreControlFlowTransfers((EffectAnalyzer *)local_640);
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)
                 &cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                 ,this->passOptions,this->module,(Expression *)pEVar1[1].type.id);
      pPVar2 = this->passOptions;
      ifFalseEffects.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->module;
      postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ =
           pPVar2->ignoreImplicitTraps;
      postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ =
           pPVar2->trapsNeverHappen;
      ifFalseEffects._0_8_ =
           (pPVar2->funcEffectsMap).
           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      ifFalseEffects.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                (pPVar2->funcEffectsMap).
                super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ifFalseEffects.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ifFalseEffects.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ifFalseEffects.funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ifFalseEffects.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ifFalseEffects.funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_M_use_count + 1;
        }
      }
      ifFalseEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&ifFalseEffects.localsRead;
      ifFalseEffects.module._0_4_ =
           (((Module *)
            ifFalseEffects.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->features).features;
      ifFalseEffects.module._4_2_ = 0;
      ifFalseEffects.localsRead._M_t._M_impl._0_4_ = 0;
      ifFalseEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      ifFalseEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      ifFalseEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      ifFalseEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&ifFalseEffects.localsWritten;
      ifFalseEffects.localsWritten._M_t._M_impl._0_4_ = 0;
      ifFalseEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      ifFalseEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      ifFalseEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      ifFalseEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&ifFalseEffects.mutableGlobalsRead;
      ifFalseEffects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
      ifFalseEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _S_red;
      ifFalseEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      ifFalseEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      ifFalseEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&ifFalseEffects.globalsWritten;
      ifFalseEffects.globalsWritten._M_t._M_impl._0_4_ = 0;
      ifFalseEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      ifFalseEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      ifFalseEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&ifFalseEffects.breakTargets;
      ifFalseEffects.breakTargets._M_t._M_impl._0_4_ = 0;
      ifFalseEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      ifFalseEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      ifFalseEffects.readsMemory = false;
      ifFalseEffects.writesMemory = false;
      ifFalseEffects.readsTable = false;
      ifFalseEffects.writesTable = false;
      ifFalseEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      ifFalseEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      ifFalseEffects.trap = false;
      ifFalseEffects.implicitTrap = false;
      ifFalseEffects.isAtomic = false;
      ifFalseEffects.throws_ = false;
      ifFalseEffects._244_4_ = 0;
      ifFalseEffects.tryDepth = 0;
      ifFalseEffects.catchDepth._0_1_ = 0;
      ifFalseEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&ifFalseEffects.delegateTargets;
      ifFalseEffects.delegateTargets._M_t._M_impl._0_4_ = 0;
      ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      ifFalseEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           ifFalseEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      ifFalseEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           ifFalseEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      ifFalseEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           ifFalseEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      ifFalseEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           ifFalseEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      ifFalseEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           ifFalseEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (*(Expression **)(pEVar1 + 2) != (Expression *)0x0) {
        EffectAnalyzer::walk
                  ((EffectAnalyzer *)
                   &postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   *(Expression **)(pEVar1 + 2));
      }
      pPVar2 = this->passOptions;
      postIfEffects.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->module;
      ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ =
           pPVar2->ignoreImplicitTraps;
      ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ =
           pPVar2->trapsNeverHappen;
      postIfEffects._0_8_ =
           (pPVar2->funcEffectsMap).
           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      postIfEffects.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                (pPVar2->funcEffectsMap).
                super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          postIfEffects.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          postIfEffects.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               postIfEffects.funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          postIfEffects.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               postIfEffects.funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_M_use_count + 1;
        }
      }
      postIfEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&postIfEffects.localsRead;
      postIfEffects.module._0_4_ =
           (((Module *)
            postIfEffects.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->features).features;
      postIfEffects.module._4_2_ = 0;
      postIfEffects.localsRead._M_t._M_impl._0_4_ = 0;
      postIfEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      postIfEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      postIfEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      postIfEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&postIfEffects.localsWritten;
      postIfEffects.localsWritten._M_t._M_impl._0_4_ = 0;
      postIfEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      postIfEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      postIfEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      postIfEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&postIfEffects.mutableGlobalsRead;
      postIfEffects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
      postIfEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _S_red;
      postIfEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      postIfEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      postIfEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&postIfEffects.globalsWritten;
      postIfEffects.globalsWritten._M_t._M_impl._0_4_ = 0;
      postIfEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      postIfEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      postIfEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&postIfEffects.breakTargets;
      postIfEffects.breakTargets._M_t._M_impl._0_4_ = 0;
      postIfEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      postIfEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      postIfEffects.readsMemory = false;
      postIfEffects.writesMemory = false;
      postIfEffects.readsTable = false;
      postIfEffects.writesTable = false;
      postIfEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      postIfEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      postIfEffects.trap = false;
      postIfEffects.implicitTrap = false;
      postIfEffects.isAtomic = false;
      postIfEffects.throws_ = false;
      postIfEffects._244_4_ = 0;
      postIfEffects.tryDepth = 0;
      postIfEffects.catchDepth._0_1_ = 0;
      postIfEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&postIfEffects.delegateTargets;
      postIfEffects.delegateTargets._M_t._M_impl._0_4_ = 0;
      postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      uVar4 = pushPoint + 1;
      postIfEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           postIfEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      postIfEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           postIfEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      postIfEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           postIfEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      postIfEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           postIfEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      postIfEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           postIfEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      while( true ) {
        uVar5 = (ulong)uVar4;
        if ((this->list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
            .usedElements <= uVar5) break;
        uVar4 = uVar4 + 1;
        EffectAnalyzer::walk
                  ((EffectAnalyzer *)
                   &ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (this->list->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
                   [uVar5]);
      }
      pushable._4_4_ = pushPoint;
      if (pushPoint != firstPushable) {
        do {
          if (pushable._4_4_ == 0) {
            __assert_fail("i > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CodePushing.cpp"
                          ,0x143,"void wasm::Pusher::optimizeIntoIf(Index, Index)");
          }
          pushable._4_4_ = pushable._4_4_ - 1;
          if ((this->list->
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
              usedElements <= (ulong)pushable._4_4_) goto LAB_00690a22;
          pLStack_40 = isPushable(this,(this->list->
                                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                       ).data[pushable._4_4_]);
          if ((pLStack_40 != (LocalSet *)0x0) &&
             ((pLStack_40->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.
              id == 1)) {
            pLStack_40 = (LocalSet *)0x0;
          }
          if (pLStack_40 == (LocalSet *)0x0) {
            if ((this->list->
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                usedElements <= (ulong)pushable._4_4_) goto LAB_00690a22;
            EffectAnalyzer::walk
                      ((EffectAnalyzer *)local_640,
                       (this->list->
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                       data[pushable._4_4_]);
          }
          else {
            local_44 = pLStack_40->index;
            other = getPushableEffects(this,pLStack_40);
            bVar3 = EffectAnalyzer::invalidates((EffectAnalyzer *)local_640,other);
            if (bVar3) {
              if ((this->list->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                  usedElements <= (ulong)pushable._4_4_) goto LAB_00690a22;
              EffectAnalyzer::walk
                        ((EffectAnalyzer *)local_640,
                         (this->list->
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
                         .data[pushable._4_4_]);
            }
            else {
              ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)&local_44;
              bVar3 = optimizeIntoIf::anon_class_40_5_af6c749e::operator()
                                ((anon_class_40_5_af6c749e *)
                                 &ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count,(Expression **)&pEVar1[1].type,
                                 *(Expression **)(pEVar1 + 2),
                                 (EffectAnalyzer *)
                                 &cumulativeEffects.delegateTargets._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 (EffectAnalyzer *)
                                 &postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
              if (!bVar3) {
                bVar3 = optimizeIntoIf::anon_class_40_5_af6c749e::operator()
                                  ((anon_class_40_5_af6c749e *)
                                   &ifFalseEffects.delegateTargets._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count,(Expression **)(pEVar1 + 2),
                                   (Expression *)pEVar1[1].type.id,
                                   (EffectAnalyzer *)
                                   &postIfEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header
                                    ._M_node_count,
                                   (EffectAnalyzer *)
                                   &cumulativeEffects.delegateTargets._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count);
                if (!bVar3) {
                  EffectAnalyzer::mergeIn((EffectAnalyzer *)local_640,other);
                }
              }
            }
          }
        } while (pushable._4_4_ != firstPushable);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&postIfEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&postIfEffects.danglingPop);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&postIfEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&postIfEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&postIfEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&postIfEffects.features);
      if (postIfEffects.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   postIfEffects.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&ifFalseEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&ifFalseEffects.danglingPop);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&ifFalseEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&ifFalseEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&ifFalseEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&ifFalseEffects.features);
      if (ifFalseEffects.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ifFalseEffects.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&ifTrueEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&ifTrueEffects.danglingPop);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&ifTrueEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&ifTrueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&ifTrueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&ifTrueEffects.features);
      if (ifTrueEffects.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ifTrueEffects.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&cumulativeEffects.breakTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&cumulativeEffects.danglingPop);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&cumulativeEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&cumulativeEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&cumulativeEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&cumulativeEffects.features);
      if (cumulativeEffects.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   cumulativeEffects.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
    }
    return;
  }
LAB_00690a22:
  __assert_fail("index < usedElements",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                ,0xbc,
                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
}

Assistant:

void optimizeIntoIf(Index firstPushable, Index pushPoint) {
    assert(firstPushable != Index(-1) && pushPoint != Index(-1) &&
           firstPushable < pushPoint);

    auto* iff = list[pushPoint]->dynCast<If>();
    if (!iff) {
      return;
    }

    // Everything that matters if you want to be pushed past the pushPoint. This
    // begins with the if condition's effects, as we must always push past
    // those. Later, we will add to this when we need to.
    EffectAnalyzer cumulativeEffects(passOptions, module, iff->condition);

    // See optimizeSegment for why we can ignore control flow transfers here.
    cumulativeEffects.ignoreControlFlowTransfers();

    // Find the effects of the arms, which will affect what can be pushed.
    EffectAnalyzer ifTrueEffects(passOptions, module, iff->ifTrue);
    EffectAnalyzer ifFalseEffects(passOptions, module);
    if (iff->ifFalse) {
      ifFalseEffects.walk(iff->ifFalse);
    }

    // We need to know which locals are used after the if, as that can determine
    // if we can push or not.
    EffectAnalyzer postIfEffects(passOptions, module);
    for (Index i = pushPoint + 1; i < list.size(); i++) {
      postIfEffects.walk(list[i]);
    }

    // Start at the instruction right before the push point, and go back from
    // there:
    //
    //    x = op();
    //    y = op();
    //    if (..) {
    //      ..
    //    }
    //
    // Here we will try to push y first, and then x. Note that if we push y
    // then we can immediately try to push x after it, as it will remain in
    // order with x if we do. If we do *not* push y we can still try to push x
    // but we must move it past y, which means we need to check for interference
    // between them (which we do by adding y's effects to cumulativeEffects).
    //
    // Decrement at the top of the loop for simplicity, so start with i at one
    // past the first thing we can push (which is right before the push point).
    Index i = pushPoint;
    while (1) {
      if (i == firstPushable) {
        // We just finished processing the first thing that could be pushed;
        // stop.
        break;
      }
      assert(i > 0);
      i--;
      auto* pushable = isPushable(list[i]);
      if (pushable && pushable->type == Type::unreachable) {
        // Don't try to push something unreachable. If we did, then we'd need to
        // refinalize the block we are moving it from:
        //
        //  (block $unreachable
        //    (local.set $x (unreachable))
        //    (if (..)
        //      (.. (local.get $x))
        //  )
        //
        // The block should not be unreachable if the local.set is moved into
        // the if arm (the if arm may not execute, so the if itself will not
        // change type). It is simpler to avoid this complexity and leave this
        // to DCE to simplify first.
        //
        // (Note that the side effect of trapping will normally prevent us from
        // trying to push something unreachable, but in traps-never-happen mode
        // we are allowed to ignore that, and so we need this check.)
        pushable = nullptr;
      }
      if (!pushable) {
        // Something that is staying where it is, so anything we push later must
        // move past it. Note the effects and continue.
        cumulativeEffects.walk(list[i]);
        continue;
      }

      auto index = pushable->index;

      const auto& effects = getPushableEffects(pushable);

      if (cumulativeEffects.invalidates(effects)) {
        // This can't be moved forward. Add it to the things that are not
        // moving.
        cumulativeEffects.walk(list[i]);
        continue;
      }

      // We only try to push into an arm if the local is used there. If the
      // local is not used in either arm then we'll want to push it past the
      // entire if, which is what optimizeSegment handles.
      //
      // We can push into the if-true arm if the local cannot be used if we go
      // through the other arm:
      //
      //    x = op();
      //    if (..) {
      //      // we would like to move "x = op()" to here
      //      ..
      //    } else {
      //      use(x);
      //    }
      //    use(x);
      //
      // Either of those use(x)s would stop us from moving to if-true arm.
      //
      // One specific case we handle is if there is a use after the if but the
      // arm we don't push into is unreachable. In that case we only get to the
      // later code after going through the reachable arm, which is ok to push
      // into:
      //
      //    x = op();
      //    if (..) {
      //      // We'll push "x = op()" to here.
      //      use(x);
      //    } else {
      //      return;
      //    }
      //    use(x);
      auto maybePushInto = [&](Expression*& arm,
                               const Expression* otherArm,
                               EffectAnalyzer& armEffects,
                               const EffectAnalyzer& otherArmEffects) {
        if (!arm || !armEffects.localsRead.count(index) ||
            otherArmEffects.localsRead.count(index)) {
          // No arm, or this arm has no read of the index, or the other arm
          // reads the index.
          return false;
        }
        if (postIfEffects.localsRead.count(index) &&
            (!otherArm || otherArm->type != Type::unreachable)) {
          // The local is read later, which is bad, and there is no unreachable
          // in the other arm which as mentioned above is the only thing that
          // could have made it work out for us.
          return false;
        }

        // We can do it! Push into one of the if's arms, and put a nop where it
        // used to be.
        Builder builder(module);
        auto* block = builder.blockify(arm);
        arm = block;
        // TODO: this is quadratic in the number of pushed things
        ExpressionManipulator::spliceIntoBlock(block, 0, pushable);
        list[i] = builder.makeNop();

        // The code we pushed adds to the effects in that arm.
        armEffects.walk(pushable);

        // TODO: After pushing we could recurse and run both this function and
        //       optimizeSegment in that location. For now, leave that to later
        //       cycles of the optimizer, as this case seems rairly rare.
        return true;
      };

      if (!maybePushInto(
            iff->ifTrue, iff->ifFalse, ifTrueEffects, ifFalseEffects) &&
          !maybePushInto(
            iff->ifFalse, iff->ifTrue, ifFalseEffects, ifTrueEffects)) {
        // We didn't push this anywhere, so further pushables must pass it.
        cumulativeEffects.mergeIn(effects);
      }
    }
  }